

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.hpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
gl3cts::ClipDistance::Utility::VertexBufferObject<int>::readBuffer
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,VertexBufferObject<int> *this)

{
  void *__src;
  socklen_t in_ECX;
  sockaddr *__addr;
  ulong __n;
  allocator_type local_11;
  
  __n = (ulong)(long)this->m_size >> 2;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__,__n,&local_11);
  bind(this,(int)__n,__addr,in_ECX);
  __src = (*this->m_gl->mapBuffer)(this->m_target,35000);
  if (__src != (void *)0x0) {
    memcpy((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start,__src,(long)this->m_size);
  }
  (*this->m_gl->unmapBuffer)(this->m_target);
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> gl3cts::ClipDistance::Utility::VertexBufferObject<T>::readBuffer()
{
	std::vector<T> buffer_data(m_size / sizeof(T));

	bind();

	glw::GLvoid* results = m_gl.mapBuffer(m_target, GL_READ_ONLY);

	if (results)
	{
		memcpy(&buffer_data[0], results, m_size);
	}

	m_gl.unmapBuffer(m_target);

	return buffer_data;
}